

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRackpinion.cpp
# Opt level: O3

void __thiscall chrono::ChLinkRackpinion::ArchiveOUT(ChLinkRackpinion *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChFrame<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkRackpinion>(marchive);
  ChLinkMateGeneric::ArchiveOUT(&this->super_ChLinkMateGeneric,marchive);
  local_38._value = (ChFrame<double> *)&this->R;
  local_38._name = "R";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = (ChFrame<double> *)&this->alpha;
  local_38._name = "alpha";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = (ChFrame<double> *)&this->beta;
  local_38._name = "beta";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = (ChFrame<double> *)&this->phase;
  local_38._name = "phase";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = (ChFrame<double> *)&this->checkphase;
  local_38._name = "checkphase";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_38._value = (ChFrame<double> *)&this->a1;
  local_38._name = "a1";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = &this->local_pinion;
  local_38._name = "local_pinion";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFrame<double>>(marchive,&local_38);
  local_38._value = &this->local_rack;
  local_38._name = "local_rack";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFrame<double>>(marchive,&local_38);
  return;
}

Assistant:

void ChLinkRackpinion::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkRackpinion>();

    // serialize parent class
    ChLinkMateGeneric::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(R);
    marchive << CHNVP(alpha);
    marchive << CHNVP(beta);
    marchive << CHNVP(phase);
    marchive << CHNVP(checkphase);
    marchive << CHNVP(a1);
    marchive << CHNVP(local_pinion);
    marchive << CHNVP(local_rack);
}